

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  FILE *pFVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  undefined8 uVar9;
  png_structp ppVar10;
  long lVar11;
  int i;
  ulong uVar12;
  int i_1;
  size_t sStack_50;
  png_structp dummy_ptr;
  
  fprintf(_stdout,"\n Testing libpng version %s\n","1.6.48.git");
  fprintf(_stdout,"   with zlib   version %s\n","1.2.11");
  pFVar2 = _stdout;
  pcVar8 = (char *)png_get_copyright(0);
  fputs(pcVar8,pFVar2);
  pFVar2 = _stdout;
  uVar4 = png_access_version_number();
  uVar9 = png_get_header_version(0);
  fprintf(pFVar2," library (%lu):%s",(ulong)uVar4,uVar9);
  fprintf(_stdout," pngtest (%lu):%s",0x2998," libpng version 1.6.48.git\n");
  pcVar8 = (char *)png_get_header_ver(0);
  iVar5 = strcmp(pcVar8,"1.6.48.git");
  if (iVar5 != 0) {
    fwrite("Warning: mismatching versions of png.h and png.c\n",0x31,1,_stdout);
    fprintf(_stdout,"  png.h version string: %s\n","1.6.48.git");
    pFVar2 = _stdout;
    uVar9 = png_get_header_ver(0);
    fprintf(pFVar2,"  png.c version string: %s\n\n",uVar9);
  }
  uVar4 = (uint)(iVar5 != 0);
  if (argc < 2) goto LAB_00103ae6;
  pcVar8 = argv[1];
  cVar1 = *pcVar8;
  if (((cVar1 == '-') && (pcVar8[1] == 'm')) && (pcVar8[2] == '\0')) {
    status_dots_requested = 0;
  }
  else {
    iVar5 = strcmp(pcVar8,"-mv");
    if (iVar5 != 0) {
      iVar5 = strcmp(pcVar8,"-vm");
      if (iVar5 != 0) {
        if (((cVar1 == '-') && (pcVar8[1] == 'v')) && (pcVar8[2] == '\0')) {
          verbose = 1;
          status_dots_requested = 1;
          inname = argv[2];
LAB_00103ae6:
          iVar5 = verbose + 3;
          if (iVar5 == argc) {
            outname = argv[(ulong)(uint)verbose + 2];
          }
          if (iVar5 < argc) {
            fprintf(_stdout,"usage: %s [infile.png] [outfile.png]\n\t%s -m {infile.png}\n",*argv);
            fwrite("  reads/writes one PNG file (without -m) or multiple files (-m)\n",0x40,1,
                   _stdout);
            fprintf(_stdout,"  with -m %s is used as a temporary file\n",outname);
            exit(1);
          }
          iVar5 = 0;
          do {
            if (iVar5 == 1) {
              status_dots_requested = 1;
              bVar3 = verbose;
            }
            else {
              if (iVar5 == 3) goto LAB_00103c33;
              bVar3 = 1;
              if (verbose == 0) {
                status_dots_requested = 0;
                bVar3 = 0;
              }
            }
            if (((iVar5 == 0) || ((bVar3 & 1) != 0)) || (uVar4 != 0)) {
              fprintf(_stdout,"\n Testing %s:");
            }
            iVar6 = test_one_file(inname,outname);
            if (iVar6 == 0) {
              if (iVar5 == 2 || (verbose & 1) != 0) {
                fprintf(_stdout,"\n PASS (%lu zero samples)\n",(ulong)zero_samples);
                if (tIME_chunk_present != 0) {
                  fprintf(_stdout," tIME = %s\n",tIME_string);
                }
              }
            }
            else {
              if (iVar5 != 2 && (verbose & 1) == 0) {
                fprintf(_stdout,"\n Testing %s:",inname);
              }
              if (xfail == 0) {
                fwrite(" FAIL\n",6,1,_stdout);
                uVar4 = uVar4 + iVar6;
              }
              else {
                fwrite(" XFAIL\n",7,1,_stdout);
              }
            }
            iVar5 = iVar5 + 1;
          } while( true );
        }
        iVar5 = strcmp(pcVar8,"--strict");
        if (iVar5 == 0) {
          status_dots_requested = 0;
          verbose = 1;
          inname = argv[2];
          strict = strict + 1;
          relaxed = 0;
          goto LAB_0010398c;
        }
        iVar5 = strcmp(pcVar8,"--relaxed");
        if (iVar5 == 0) {
          inname = argv[2];
        }
        else {
          iVar5 = strcmp(pcVar8,"--xfail");
          if (iVar5 != 0) {
            status_dots_requested = 0;
            inname = pcVar8;
            goto LAB_00103ae6;
          }
          inname = argv[2];
          xfail = xfail + 1;
        }
        strict = 0;
        verbose = 1;
        status_dots_requested = 0;
        relaxed = relaxed + 1;
        goto LAB_0010398c;
      }
    }
    verbose = 1;
    status_dots_requested = 1;
  }
LAB_0010398c:
  for (uVar12 = 2; uVar12 < (uint)argc; uVar12 = uVar12 + 1) {
    fprintf(_stdout,"\n Testing %s:",argv[uVar12]);
    iVar5 = test_one_file(argv[uVar12],outname);
    if (iVar5 == 0) {
      fprintf(_stdout,"\n PASS (%lu zero samples)\n",(ulong)zero_samples);
      if (tIME_chunk_present != 0) {
        fprintf(_stdout," tIME = %s\n",tIME_string);
      }
      tIME_chunk_present = 0;
    }
    else if (xfail == 0) {
      fwrite(" FAIL\n",6,1,_stdout);
      uVar4 = uVar4 + 1;
    }
    else {
      fwrite(" XFAIL\n",7,1,_stdout);
    }
  }
LAB_00103c33:
  if (uVar4 == 0) {
    pcVar8 = " libpng passes test\n";
    sStack_50 = 0x14;
  }
  else {
    pcVar8 = " libpng FAILS test\n";
    sStack_50 = 0x13;
  }
  fwrite(pcVar8,sStack_50,1,_stdout);
  ppVar10 = (png_structp)png_create_read_struct("1.6.48.git",0,0,0);
  dummy_ptr = ppVar10;
  fwrite(" Default limits:\n",0x11,1,_stdout);
  pFVar2 = _stdout;
  uVar7 = png_get_user_width_max(ppVar10);
  fprintf(pFVar2,"  width_max  = %lu\n",(ulong)uVar7);
  pFVar2 = _stdout;
  uVar7 = png_get_user_height_max(ppVar10);
  fprintf(pFVar2,"  height_max = %lu\n",(ulong)uVar7);
  iVar5 = png_get_chunk_cache_max(ppVar10);
  pFVar2 = _stdout;
  if (iVar5 == 0) {
    fwrite("  cache_max  = unlimited\n",0x19,1,_stdout);
  }
  else {
    uVar7 = png_get_chunk_cache_max(ppVar10);
    fprintf(pFVar2,"  cache_max  = %lu\n",(ulong)uVar7);
  }
  lVar11 = png_get_chunk_malloc_max(ppVar10);
  pFVar2 = _stdout;
  if (lVar11 == 0) {
    fwrite("  malloc_max = unlimited\n",0x19,1,_stdout);
  }
  else {
    uVar9 = png_get_chunk_malloc_max(ppVar10);
    fprintf(pFVar2,"  malloc_max = %lu\n",uVar9);
  }
  png_destroy_read_struct(&dummy_ptr,0,0);
  return (int)(uVar4 != 0);
}

Assistant:

int
main(int argc, char *argv[])
{
   int multiple = 0;
   int ierror = 0;

   png_structp dummy_ptr;

   fprintf(STDERR, "\n Testing libpng version %s\n", PNG_LIBPNG_VER_STRING);
   fprintf(STDERR, "   with zlib   version %s\n", ZLIB_VERSION);
   fprintf(STDERR, "%s", png_get_copyright(NULL));
   /* Show the version of libpng used in building the library */
   fprintf(STDERR, " library (%lu):%s",
       (unsigned long)png_access_version_number(),
       png_get_header_version(NULL));

   /* Show the version of libpng used in building the application */
   fprintf(STDERR, " pngtest (%lu):%s", (unsigned long)PNG_LIBPNG_VER,
       PNG_HEADER_VERSION_STRING);

   /* Do some consistency checking on the memory allocation settings, I'm
    * not sure this matters, but it is nice to know, the first of these
    * tests should be impossible because of the way the macros are set
    * in pngconf.h
    */
#if defined(MAXSEG_64K) && !defined(PNG_MAX_MALLOC_64K)
      fprintf(STDERR, " NOTE: Zlib compiled for max 64k, libpng not\n");
#endif
   /* I think the following can happen. */
#if !defined(MAXSEG_64K) && defined(PNG_MAX_MALLOC_64K)
      fprintf(STDERR, " NOTE: libpng compiled for max 64k, zlib not\n");
#endif

   if (strcmp(png_libpng_ver, PNG_LIBPNG_VER_STRING) != 0)
   {
      fprintf(STDERR, "Warning: mismatching versions of png.h and png.c\n");
      fprintf(STDERR, "  png.h version string: %s\n", PNG_LIBPNG_VER_STRING);
      fprintf(STDERR, "  png.c version string: %s\n\n", png_libpng_ver);
      ++ierror;
   }

   if (argc > 1)
   {
      if (strcmp(argv[1], "-m") == 0)
      {
         multiple = 1;
         status_dots_requested = 0;
      }

      else if (strcmp(argv[1], "-mv") == 0 ||
               strcmp(argv[1], "-vm") == 0 )
      {
         multiple = 1;
         verbose = 1;
         status_dots_requested = 1;
      }

      else if (strcmp(argv[1], "-v") == 0)
      {
         verbose = 1;
         status_dots_requested = 1;
         inname = argv[2];
      }

      else if (strcmp(argv[1], "--strict") == 0)
      {
         status_dots_requested = 0;
         verbose = 1;
         inname = argv[2];
         strict++;
         relaxed = 0;
         multiple = 1;
      }

      else if (strcmp(argv[1], "--relaxed") == 0)
      {
         status_dots_requested = 0;
         verbose = 1;
         inname = argv[2];
         strict = 0;
         relaxed++;
         multiple = 1;
      }
      else if (strcmp(argv[1], "--xfail") == 0)
      {
         status_dots_requested = 0;
         verbose = 1;
         inname = argv[2];
         strict = 0;
         xfail++;
         relaxed++;
         multiple = 1;
      }

      else
      {
         inname = argv[1];
         status_dots_requested = 0;
      }
   }

   if (multiple == 0 && argc == 3 + verbose)
      outname = argv[2 + verbose];

   if ((multiple == 0 && argc > 3 + verbose) ||
       (multiple != 0 && argc < 2))
   {
      fprintf(STDERR,
          "usage: %s [infile.png] [outfile.png]\n\t%s -m {infile.png}\n",
          argv[0], argv[0]);
      fprintf(STDERR,
          "  reads/writes one PNG file (without -m) or multiple files (-m)\n");
      fprintf(STDERR,
          "  with -m %s is used as a temporary file\n", outname);
      exit(1);
   }

   if (multiple != 0)
   {
      int i;
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
      int allocation_now = current_allocation;
#endif
      for (i = 2; i < argc; ++i)
      {
         int kerror;
         fprintf(STDERR, "\n Testing %s:", argv[i]);
#if PNG_DEBUG > 0
         fprintf(STDERR, "\n");
#endif
         kerror = test_one_file(argv[i], outname);
         if (kerror == 0)
         {
#ifdef PNG_WRITE_USER_TRANSFORM_SUPPORTED
            fprintf(STDERR, "\n PASS (%lu zero samples)\n",
                (unsigned long)zero_samples);
#else
            fprintf(STDERR, " PASS\n");
#endif
#ifdef PNG_TIME_RFC1123_SUPPORTED
            if (tIME_chunk_present != 0)
               fprintf(STDERR, " tIME = %s\n", tIME_string);

            tIME_chunk_present = 0;
#endif /* TIME_RFC1123 */
         }

         else
         {
            if (xfail)
              fprintf(STDERR, " XFAIL\n");
            else
            {
              fprintf(STDERR, " FAIL\n");
              ierror += kerror;
            }
         }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         if (allocation_now != current_allocation)
            fprintf(STDERR, "MEMORY ERROR: %d bytes lost\n",
                current_allocation - allocation_now);

         if (current_allocation != 0)
         {
            memory_infop pinfo = pinformation;

            fprintf(STDERR, "MEMORY ERROR: %d bytes still allocated\n",
                current_allocation);

            while (pinfo != NULL)
            {
               fprintf(STDERR, " %lu bytes at %p\n",
                   (unsigned long)pinfo->size,
                   pinfo->pointer);
               pinfo = pinfo->next;
            }
         }
#endif
      }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         fprintf(STDERR, " Current memory allocation: %10d bytes\n",
             current_allocation);
         fprintf(STDERR, " Maximum memory allocation: %10d bytes\n",
             maximum_allocation);
         fprintf(STDERR, " Total   memory allocation: %10d bytes\n",
             total_allocation);
         fprintf(STDERR, "     Number of allocations: %10d\n",
             num_allocations);
#endif
   }

   else
   {
      int i;
      for (i = 0; i < 3; ++i)
      {
         int kerror;
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         int allocation_now = current_allocation;
#endif
         if (i == 1)
            status_dots_requested = 1;

         else if (verbose == 0)
            status_dots_requested = 0;

         if (i == 0 || verbose == 1 || ierror != 0)
         {
            fprintf(STDERR, "\n Testing %s:", inname);
#if PNG_DEBUG > 0
            fprintf(STDERR, "\n");
#endif
         }

         kerror = test_one_file(inname, outname);

         if (kerror == 0)
         {
            if (verbose == 1 || i == 2)
            {
#ifdef PNG_WRITE_USER_TRANSFORM_SUPPORTED
                fprintf(STDERR, "\n PASS (%lu zero samples)\n",
                    (unsigned long)zero_samples);
#else
                fprintf(STDERR, " PASS\n");
#endif
#ifdef PNG_TIME_RFC1123_SUPPORTED
             if (tIME_chunk_present != 0)
                fprintf(STDERR, " tIME = %s\n", tIME_string);
#endif /* TIME_RFC1123 */
            }
         }

         else
         {
            if (verbose == 0 && i != 2)
            {
               fprintf(STDERR, "\n Testing %s:", inname);
#if PNG_DEBUG > 0
               fprintf(STDERR, "\n");
#endif
            }

            if (xfail)
              fprintf(STDERR, " XFAIL\n");
            else
            {
              fprintf(STDERR, " FAIL\n");
              ierror += kerror;
            }
         }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
         if (allocation_now != current_allocation)
             fprintf(STDERR, "MEMORY ERROR: %d bytes lost\n",
                 current_allocation - allocation_now);

         if (current_allocation != 0)
         {
             memory_infop pinfo = pinformation;

             fprintf(STDERR, "MEMORY ERROR: %d bytes still allocated\n",
                 current_allocation);

             while (pinfo != NULL)
             {
                fprintf(STDERR, " %lu bytes at %p\n",
                    (unsigned long)pinfo->size, pinfo->pointer);
                pinfo = pinfo->next;
             }
          }
#endif
       }
#if defined(PNG_USER_MEM_SUPPORTED) && PNG_DEBUG
       fprintf(STDERR, " Current memory allocation: %10d bytes\n",
           current_allocation);
       fprintf(STDERR, " Maximum memory allocation: %10d bytes\n",
           maximum_allocation);
       fprintf(STDERR, " Total   memory allocation: %10d bytes\n",
           total_allocation);
       fprintf(STDERR, "     Number of allocations: %10d\n",
           num_allocations);
#endif
   }

#ifdef PNGTEST_TIMING
   t_stop = (float)clock();
   t_misc += (t_stop - t_start);
   t_start = t_stop;
   fprintf(STDERR, " CPU time used = %.3f seconds",
       (t_misc+t_decode+t_encode)/(float)CLOCKS_PER_SEC);
   fprintf(STDERR, " (decoding %.3f,\n",
       t_decode/(float)CLOCKS_PER_SEC);
   fprintf(STDERR, "        encoding %.3f ,",
       t_encode/(float)CLOCKS_PER_SEC);
   fprintf(STDERR, " other %.3f seconds)\n\n",
       t_misc/(float)CLOCKS_PER_SEC);
#endif

   if (ierror == 0)
      fprintf(STDERR, " libpng passes test\n");

   else
      fprintf(STDERR, " libpng FAILS test\n");

   dummy_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
#ifdef PNG_USER_LIMITS_SUPPORTED
   fprintf(STDERR, " Default limits:\n");
   fprintf(STDERR, "  width_max  = %lu\n",
       (unsigned long) png_get_user_width_max(dummy_ptr));
   fprintf(STDERR, "  height_max = %lu\n",
       (unsigned long) png_get_user_height_max(dummy_ptr));
   if (png_get_chunk_cache_max(dummy_ptr) == 0)
      fprintf(STDERR, "  cache_max  = unlimited\n");
   else
      fprintf(STDERR, "  cache_max  = %lu\n",
          (unsigned long) png_get_chunk_cache_max(dummy_ptr));
   if (png_get_chunk_malloc_max(dummy_ptr) == 0)
      fprintf(STDERR, "  malloc_max = unlimited\n");
   else
      fprintf(STDERR, "  malloc_max = %lu\n",
          (unsigned long) png_get_chunk_malloc_max(dummy_ptr));
#endif
   png_destroy_read_struct(&dummy_ptr, NULL, NULL);

   return (ierror != 0);
}